

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall
anon_unknown.dwarf_4447fb::Db::parseCtorDtorName(Db *this,Node **SoFar,NameState *State)

{
  bool bVar1;
  char cVar2;
  ExpandedSpecialSubstitution *pEVar3;
  Node *pNVar4;
  bool local_2f;
  bool local_2e;
  byte local_2d;
  SpecialSubKind local_2c;
  bool IsInherited;
  NameState *pNStack_28;
  SpecialSubKind SSK;
  NameState *State_local;
  Node **SoFar_local;
  Db *this_local;
  
  pNStack_28 = State;
  State_local = (NameState *)SoFar;
  SoFar_local = (Node **)this;
  if (((*SoFar)->K == KSpecialSubstitution) &&
     (local_2c = *(SpecialSubKind *)&(*SoFar)->field_0xc, local_2c - string < 4)) {
    pEVar3 = (anonymous_namespace)::Db::
             make<(anonymous_namespace)::ExpandedSpecialSubstitution,(anonymous_namespace)::SpecialSubKind&>
                       ((Db *)this,&local_2c);
    *(ExpandedSpecialSubstitution **)State_local = pEVar3;
  }
  bVar1 = consumeIf(this,'C');
  if (bVar1) {
    local_2d = consumeIf(this,'I');
    cVar2 = look(this,0);
    if ((((cVar2 == '1') || (cVar2 = look(this,0), cVar2 == '2')) ||
        (cVar2 = look(this,0), cVar2 == '3')) || (cVar2 = look(this,0), cVar2 == '5')) {
      this->First = this->First + 1;
      if (pNStack_28 != (NameState *)0x0) {
        pNStack_28->CtorDtorConversion = true;
      }
      if (((local_2d & 1) == 0) || (pNVar4 = parseName(this,pNStack_28), pNVar4 != (Node *)0x0)) {
        local_2e = false;
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::CtorDtorName,(anonymous_namespace)::Node*&,bool>
                                     ((Db *)this,(Node **)State_local,&local_2e);
      }
      else {
        this_local = (Db *)0x0;
      }
    }
    else {
      this_local = (Db *)0x0;
    }
  }
  else {
    cVar2 = look(this,0);
    if ((cVar2 == 'D') &&
       (((cVar2 = look(this,1), cVar2 == '0' || (cVar2 = look(this,1), cVar2 == '1')) ||
        ((cVar2 = look(this,1), cVar2 == '2' || (cVar2 = look(this,1), cVar2 == '5')))))) {
      this->First = this->First + 2;
      if (pNStack_28 != (NameState *)0x0) {
        pNStack_28->CtorDtorConversion = true;
      }
      local_2f = true;
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::CtorDtorName,(anonymous_namespace)::Node*&,bool>
                                   ((Db *)this,(Node **)State_local,&local_2f);
    }
    else {
      this_local = (Db *)0x0;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseCtorDtorName(Node *&SoFar, NameState *State) {
  if (SoFar->K == Node::KSpecialSubstitution) {
    auto SSK = static_cast<SpecialSubstitution *>(SoFar)->SSK;
    switch (SSK) {
    case SpecialSubKind::string:
    case SpecialSubKind::istream:
    case SpecialSubKind::ostream:
    case SpecialSubKind::iostream:
      SoFar = make<ExpandedSpecialSubstitution>(SSK);
      break;
    default:
      break;
    }
  }

  if (consumeIf('C')) {
    bool IsInherited = consumeIf('I');
    if (look() != '1' && look() != '2' && look() != '3' && look() != '5')
      return nullptr;
    ++First;
    if (State) State->CtorDtorConversion = true;
    if (IsInherited) {
      if (parseName(State) == nullptr)
        return nullptr;
    }
    return make<CtorDtorName>(SoFar, false);
  }

  if (look() == 'D' &&
      (look(1) == '0' || look(1) == '1' || look(1) == '2' || look(1) == '5')) {
    First += 2;
    if (State) State->CtorDtorConversion = true;
    return make<CtorDtorName>(SoFar, true);
  }

  return nullptr;
}